

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-a32.inc.c
# Opt level: O0

void disas_a32_extract_s_rxr_shr(DisasContext_conflict1 *ctx,arg_s_rrr_shr *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t insn_local;
  arg_s_rrr_shr *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x14,1);
  a->s = uVar1;
  uVar1 = extract32(insn,0xc,4);
  a->rd = uVar1;
  uVar1 = extract32(insn,8,4);
  a->rs = uVar1;
  uVar1 = extract32(insn,5,2);
  a->shty = uVar1;
  uVar1 = extract32(insn,0,4);
  a->rm = uVar1;
  a->rn = 0;
  return;
}

Assistant:

static void disas_a32_extract_s_rxr_shr(DisasContext *ctx, arg_s_rrr_shr *a, uint32_t insn)
{
    a->s = extract32(insn, 20, 1);
    a->rd = extract32(insn, 12, 4);
    a->rs = extract32(insn, 8, 4);
    a->shty = extract32(insn, 5, 2);
    a->rm = extract32(insn, 0, 4);
    a->rn = 0;
}